

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

int conf_parse_file(char *file,proxy_conf *conf,log_handle *log)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  byte *pbVar3;
  byte *__ptr;
  long lVar4;
  char **ppcVar5;
  char *pcVar6;
  int *piVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  uint16_t uVar11;
  uint uVar12;
  byte *__s1;
  size_t __n;
  int iVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  byte *__src;
  ulong uVar17;
  bool bVar18;
  char dummy [2];
  
  log_printf(log,LOG_LEVEL_DEBUG,"Loading proxy config from \'%s\'\n");
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    piVar7 = __errno_location();
    return -*piVar7;
  }
LAB_0010295d:
  pbVar3 = (byte *)malloc(0x80);
  if (pbVar3 == (byte *)0x0) {
LAB_001029b9:
    __ptr = pbVar3;
    bVar18 = false;
  }
  else {
    uVar9 = 0x80;
    uVar10 = 0;
    do {
      iVar2 = fgetc(__stream);
      __ptr = pbVar3;
      uVar17 = uVar10;
      if (iVar2 == -1) break;
      uVar17 = uVar10 + 1;
      if (uVar9 <= uVar17) {
        uVar9 = uVar9 + 0x80;
        __ptr = (byte *)realloc(pbVar3,uVar9);
        if (__ptr == (byte *)0x0) goto LAB_001029b9;
      }
      __ptr[uVar10] = (byte)iVar2;
      pbVar3 = __ptr;
      uVar10 = uVar17;
    } while (iVar2 != 10);
    __ptr[uVar17] = 0;
    bVar18 = 0 < (int)uVar17;
  }
  if (bVar18) {
    pbVar3 = __ptr + -1;
    __s1 = __ptr;
    __src = __ptr;
    while( true ) {
      __src = __src + 1;
      uVar10 = (ulong)*__s1;
      if (0x3d < uVar10) break;
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
        if ((0x2000000800000001U >> (uVar10 & 0x3f) & 1) != 0) goto switchD_00102aec_caseD_5;
        break;
      }
      __s1 = __s1 + 1;
      pbVar3 = pbVar3 + 1;
    }
    lVar4 = 0;
    pbVar14 = __s1;
    for (; __src[-1] != 0; __src = __src + 1) {
      if (__src[-1] == 0x3d) {
        if (lVar4 != 0) goto LAB_00102a5d;
        goto LAB_00102a7f;
      }
      lVar4 = lVar4 + 1;
      pbVar3 = pbVar3 + 1;
      pbVar14 = pbVar14 + 1;
    }
    goto switchD_00102aec_caseD_5;
  }
  free(__ptr);
  iVar13 = 0;
  goto LAB_001030c1;
  while( true ) {
    lVar4 = lVar4 + -1;
    pbVar3 = pbVar3 + -1;
    if (lVar4 == 0) break;
LAB_00102a5d:
    if ((*pbVar3 != 0x20) && (*pbVar3 != 9)) goto LAB_00102a7f;
  }
  lVar4 = 0;
LAB_00102a7f:
  for (; (*__src == 9 || (*__src == 0x20)); __src = __src + 1) {
    pbVar14 = pbVar14 + 1;
  }
  uVar10 = 0xffffffffffffffff;
  pbVar3 = pbVar14;
  do {
    pbVar8 = pbVar3;
    lVar1 = uVar10 + 1;
    uVar10 = uVar10 + 1;
    pbVar3 = pbVar8 + 1;
  } while (__src[lVar1] != 0);
  bVar18 = uVar10 == 0;
  if (!bVar18) {
    do {
      if ((0x20 < (ulong)*pbVar8) || ((0x100002600U >> ((ulong)*pbVar8 & 0x3f) & 1) == 0))
      goto LAB_00102ad4;
      uVar10 = uVar10 - 1;
      pbVar8 = pbVar8 + -1;
      bVar18 = uVar10 == 0;
    } while (!bVar18);
    uVar10 = 0;
  }
LAB_00102ad4:
  switch(lVar4) {
  case 4:
    iVar2 = strncmp((char *)__s1,"Port",4);
    iVar13 = 0;
    if (iVar2 != 0) goto LAB_00102a1c;
    iVar13 = 0;
    iVar2 = __isoc99_sscanf(__src,"%hu%1s",&conf->port);
    if (iVar2 == 1) goto LAB_00102a1c;
    pcVar6 = "Invalid configuration value for \'Port\': \'%.*s\'\n";
    goto LAB_00102d42;
  case 5:
  case 6:
  case 7:
  case 9:
  case 10:
  case 0xc:
  case 0xe:
  case 0x12:
    goto switchD_00102aec_caseD_5;
  case 8:
    iVar2 = strncmp((char *)__s1,"Password",8);
    iVar13 = 0;
    if (iVar2 != 0) goto LAB_00102a1c;
    if (conf->password != (char *)0x0) {
      free(conf->password);
    }
    pcVar6 = (char *)malloc(uVar10 + 1);
    conf->password = pcVar6;
    if (pcVar6 == (char *)0x0) goto LAB_001030a1;
    memcpy(pcVar6,__src,uVar10);
    pcVar6[uVar10] = '\0';
    iVar2 = strcmp(pcVar6,"notset");
    if (iVar2 != 0) goto LAB_00102a1c;
    free(pcVar6);
    conf->password = (char *)0x0;
    log_printf(log,LOG_LEVEL_ERROR,"Error: Missing password\n");
    goto LAB_00102d4e;
  case 0xb:
    iVar2 = strncmp((char *)__s1,"BindAddress",0xb);
    iVar13 = 0;
    if (iVar2 != 0) goto LAB_00102a1c;
    if (conf->bind_addr != (char *)0x0) {
      free(conf->bind_addr);
    }
    if (bVar18) {
      conf->bind_addr = (char *)0x0;
      goto LAB_00102a1c;
    }
    pcVar6 = (char *)malloc(uVar10 + 1);
    conf->bind_addr = pcVar6;
    break;
  case 0xd:
    iVar2 = strncmp((char *)__s1,"PublicAddress",0xd);
    iVar13 = 0;
    if (iVar2 != 0) goto LAB_00102a1c;
    if (conf->public_addr != (char *)0x0) {
      free(conf->public_addr);
    }
    if (bVar18) {
      conf->public_addr = (char *)0x0;
      goto LAB_00102a1c;
    }
    pcVar6 = (char *)malloc(uVar10 + 1);
    conf->public_addr = pcVar6;
    break;
  case 0xf:
    iVar2 = strncmp((char *)__s1,"CallsignsDenied",0xf);
    iVar13 = 0;
    if (iVar2 != 0) goto LAB_00102a1c;
    if (conf->calls_denied != (char *)0x0) {
      free(conf->calls_denied);
    }
    if (bVar18) {
      conf->calls_denied = (char *)0x0;
      goto LAB_00102a1c;
    }
    pcVar6 = (char *)malloc(uVar10 + 1);
    conf->calls_denied = pcVar6;
    break;
  case 0x10:
    iVar2 = strncmp((char *)__s1,"CallsignsAllowed",0x10);
    iVar13 = 0;
    if (iVar2 == 0) {
      if (conf->calls_allowed != (char *)0x0) {
        free(conf->calls_allowed);
      }
      if (bVar18) {
        conf->calls_allowed = (char *)0x0;
        goto LAB_00102a1c;
      }
      pcVar6 = (char *)malloc(uVar10 + 1);
      conf->calls_allowed = pcVar6;
    }
    else {
      iVar2 = strncmp((char *)__s1,"RegistrationName",0x10);
      if (iVar2 != 0) goto LAB_00102a1c;
      if (conf->reg_name != (char *)0x0) {
        free(conf->reg_name);
      }
      if (bVar18) {
        conf->reg_name = (char *)0x0;
        goto LAB_00102a1c;
      }
      pcVar6 = (char *)malloc(uVar10 + 1);
      conf->reg_name = pcVar6;
    }
    break;
  case 0x11:
    iVar2 = strncmp((char *)__s1,"ConnectionTimeout",0x11);
    iVar13 = 0;
    if (iVar2 != 0) goto LAB_00102a1c;
    iVar13 = 0;
    iVar2 = __isoc99_sscanf(__src,"%u%1s",&conf->connection_timeout);
    if (iVar2 == 1) goto LAB_00102a1c;
    pcVar6 = "Invalid configuration value for \'ConnectionTimeout\': \'%.*s\'\n";
LAB_00102d42:
    log_printf(log,LOG_LEVEL_ERROR,pcVar6,uVar10 & 0xffffffff,__src);
LAB_00102d4e:
    iVar13 = -0x16;
    goto LAB_00102a1c;
  case 0x13:
    iVar2 = strncmp((char *)__s1,"ExternalBindAddress",0x13);
    iVar13 = 0;
    if (iVar2 == 0) {
      if (conf->bind_addr_ext != (char *)0x0) {
        free(conf->bind_addr_ext);
      }
      if (bVar18) {
        conf->bind_addr_ext = (char *)0x0;
        goto LAB_00102a1c;
      }
      pcVar6 = (char *)malloc(uVar10 + 1);
      conf->bind_addr_ext = pcVar6;
    }
    else {
      iVar2 = strncmp((char *)__s1,"RegistrationComment",0x13);
      if (iVar2 != 0) goto LAB_00102a1c;
      if (conf->reg_comment != (char *)0x0) {
        free(conf->reg_comment);
      }
      if (bVar18) {
        conf->reg_comment = (char *)0x0;
        goto LAB_00102a1c;
      }
      pcVar6 = (char *)malloc(uVar10 + 1);
      conf->reg_comment = pcVar6;
    }
    break;
  default:
    if ((lVar4 == 0x1f) &&
       (iVar2 = strncmp((char *)__s1,"AdditionalExternalBindAddresses",0x1f), iVar2 == 0)) {
      if (conf->bind_addr_ext_add != (char **)0x0) {
        free(conf->bind_addr_ext_add);
      }
      if (uVar10 == 0) {
        conf->bind_addr_ext_add = (char **)0x0;
        conf->bind_addr_ext_add_len = 0;
      }
      else {
        if (uVar10 != 1) {
          uVar9 = 1;
          do {
            if (pbVar14[uVar9 + 1] == 0x2c) {
              conf->bind_addr_ext_add_len = conf->bind_addr_ext_add_len + 1;
            }
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
        }
        uVar12 = *(int *)&conf->bind_addr_ext_add_len + 1;
        uVar11 = (uint16_t)uVar12;
        conf->bind_addr_ext_add_len = uVar11;
        ppcVar5 = (char **)calloc((ulong)(uVar12 & 0xffff),8);
        conf->bind_addr_ext_add = ppcVar5;
        if (ppcVar5 == (char **)0x0) goto LAB_001030a1;
        if (uVar11 != 0) {
          uVar9 = 0;
          uVar17 = 0;
          do {
            uVar16 = uVar9;
            uVar15 = uVar9;
            if (uVar9 < uVar10) {
              do {
                uVar16 = uVar15;
                if (__src[uVar15] == 0x2c) break;
                uVar15 = uVar15 + 1;
                uVar16 = uVar10;
              } while (uVar10 != uVar15);
            }
            __n = uVar16 - uVar9;
            pcVar6 = (char *)malloc(__n + 1);
            conf->bind_addr_ext_add[uVar17] = pcVar6;
            if (conf->bind_addr_ext_add[uVar17] == (char *)0x0) {
              iVar2 = 0xb;
              uVar9 = uVar16;
            }
            else {
              memcpy(conf->bind_addr_ext_add[uVar17],__src + uVar9,__n);
              conf->bind_addr_ext_add[uVar17][__n] = '\0';
              iVar2 = 0;
              uVar9 = uVar16 + 1;
            }
            if (iVar2 != 0) {
              if (iVar2 == 0xb) {
                if (conf->bind_addr_ext_add_len != 0) {
                  uVar10 = 0;
                  do {
                    if (conf->bind_addr_ext_add[uVar10] != (char *)0x0) {
                      free(conf->bind_addr_ext_add[uVar10]);
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar10 < conf->bind_addr_ext_add_len);
                }
                free(conf->bind_addr_ext_add);
                conf->bind_addr_ext_add = (char **)0x0;
                conf->bind_addr_ext_add_len = 0;
              }
              goto LAB_001030a1;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < conf->bind_addr_ext_add_len);
        }
      }
    }
    goto switchD_00102aec_caseD_5;
  }
  iVar13 = 0;
  if (pcVar6 == (char *)0x0) {
LAB_001030a1:
    iVar13 = -0xc;
  }
  else {
    memcpy(pcVar6,__src,uVar10);
    pcVar6[uVar10] = '\0';
  }
LAB_00102a1c:
  free(__ptr);
  if (iVar13 < 0) {
LAB_001030c1:
    fclose(__stream);
    return iVar13;
  }
  goto LAB_0010295d;
switchD_00102aec_caseD_5:
  iVar13 = 0;
  goto LAB_00102a1c;
}

Assistant:

int conf_parse_file(const char *file, struct proxy_conf *conf,
		    struct log_handle *log)
{
	FILE *stream;
	int ret;

	log_printf(log, LOG_LEVEL_DEBUG, "Loading proxy config from '%s'\n", file);

	stream = fopen(file, "r");
	if (stream == NULL)
		return -errno;

	ret = conf_parse_stream(stream, conf, log);

	fclose(stream);

	return ret;
}